

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt,int fromnr,int tonr,int counter)

{
  xmlRegStatePtr state;
  xmlRegStatePtr pxVar1;
  xmlRegTrans *pxVar2;
  int local_3c;
  int tcounter;
  xmlRegTransPtr t1;
  xmlRegStatePtr to;
  xmlRegStatePtr from;
  int transnr;
  int counter_local;
  int tonr_local;
  int fromnr_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  state = ctxt->states[fromnr];
  if ((((state != (xmlRegStatePtr)0x0) &&
       (pxVar1 = ctxt->states[tonr], pxVar1 != (xmlRegStatePtr)0x0)) &&
      (pxVar1->mark != XML_REGEXP_MARK_START)) && (pxVar1->mark != XML_REGEXP_MARK_VISITED)) {
    pxVar1->mark = XML_REGEXP_MARK_VISITED;
    if (pxVar1->type == XML_REGEXP_FINAL_STATE) {
      state->type = XML_REGEXP_FINAL_STATE;
    }
    for (from._0_4_ = 0; (int)from < pxVar1->nbTrans; from._0_4_ = (int)from + 1) {
      pxVar2 = pxVar1->trans + (int)from;
      if (-1 < pxVar2->to) {
        local_3c = counter;
        if (-1 < pxVar2->counter) {
          local_3c = pxVar2->counter;
        }
        if (pxVar2->atom == (xmlRegAtomPtr)0x0) {
          if (pxVar2->to != fromnr) {
            if (pxVar2->count < 0) {
              xmlFAReduceEpsilonTransitions(ctxt,fromnr,pxVar2->to,local_3c);
            }
            else {
              xmlRegStateAddTrans(ctxt,state,(xmlRegAtomPtr)0x0,ctxt->states[pxVar2->to],-1,
                                  pxVar2->count);
            }
          }
        }
        else {
          xmlRegStateAddTrans(ctxt,state,pxVar2->atom,ctxt->states[pxVar2->to],local_3c,-1);
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt, int fromnr,
	                      int tonr, int counter) {
    int transnr;
    xmlRegStatePtr from;
    xmlRegStatePtr to;

    from = ctxt->states[fromnr];
    if (from == NULL)
	return;
    to = ctxt->states[tonr];
    if (to == NULL)
	return;
    if ((to->mark == XML_REGEXP_MARK_START) ||
	(to->mark == XML_REGEXP_MARK_VISITED))
	return;

    to->mark = XML_REGEXP_MARK_VISITED;
    if (to->type == XML_REGEXP_FINAL_STATE) {
	from->type = XML_REGEXP_FINAL_STATE;
    }
    for (transnr = 0;transnr < to->nbTrans;transnr++) {
        xmlRegTransPtr t1 = &to->trans[transnr];
        int tcounter;

        if (t1->to < 0)
	    continue;
        if (t1->counter >= 0) {
            /* assert(counter < 0); */
            tcounter = t1->counter;
        } else {
            tcounter = counter;
        }
	if (t1->atom == NULL) {
	    /*
	     * Don't remove counted transitions
	     * Don't loop either
	     */
	    if (t1->to != fromnr) {
		if (t1->count >= 0) {
		    xmlRegStateAddTrans(ctxt, from, NULL, ctxt->states[t1->to],
					-1, t1->count);
		} else {
                    xmlFAReduceEpsilonTransitions(ctxt, fromnr, t1->to,
                                                  tcounter);
		}
	    }
	} else {
            xmlRegStateAddTrans(ctxt, from, t1->atom,
                                ctxt->states[t1->to], tcounter, -1);
	}
    }
}